

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfoSink.cpp
# Opt level: O2

void __thiscall glslang::TInfoSinkBase::append(TInfoSinkBase *this,int count,char c)

{
  uint uVar1;
  
  uVar1 = this->outputStream;
  if ((uVar1 & 4) != 0) {
    checkMem(this,(long)count);
    std::__cxx11::string::append((ulong)this,(char)count);
    uVar1 = this->outputStream;
  }
  if ((uVar1 & 2) == 0) {
    return;
  }
  fputc((int)c,_stdout);
  return;
}

Assistant:

void TInfoSinkBase::append(int count, char c)
{
    if (outputStream & EString) {
        checkMem(count);
        sink.append(count, c);
    }

//#ifdef _WIN32
//    if (outputStream & EDebugger) {
//        char str[2];
//        str[0] = c;
//        str[1] = '\0';
//        OutputDebugString(str);
//    }
//#endif

    if (outputStream & EStdOut)
        fprintf(stdout, "%c", c);
}